

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprTest_SymbolicIfExpr_Test::~ExprTest_SymbolicIfExpr_Test(ExprTest_SymbolicIfExpr_Test *this)

{
  ExprTest::~ExprTest(&this->super_ExprTest);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, SymbolicIfExpr) {
  mp::SymbolicIfExpr e;
  EXPECT_TRUE(e == 0);
  (void)Expr(e);
  auto condition = factory_.MakeLogicalConstant(true);
  Expr then_expr = factory_.MakeStringLiteral("a");
  Expr else_expr = factory_.MakeVariable(0);
  e = factory_.MakeSymbolicIf(condition, then_expr, else_expr);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::IFSYM, e.kind());
  EXPECT_EQ(condition, e.condition());
  EXPECT_EQ(then_expr, e.then_expr());
  EXPECT_EQ(else_expr, e.else_expr());
  EXPECT_ASSERT(factory_.MakeSymbolicIf(LogicalExpr(),
                                        then_expr, else_expr),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeSymbolicIf(condition, Expr(), else_expr),
                "invalid argument");
  factory_.MakeSymbolicIf(condition, then_expr, Expr());
}